

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O3

void __thiscall
avro::GenericDatum::GenericDatum<avro::GenericUnion>
          (GenericDatum *this,NodePtr *schema,GenericUnion *v)

{
  placeholder *ppVar1;
  int iVar2;
  placeholder *tmp;
  GenericUnion *this_00;
  undefined4 extraout_var;
  placeholder *ppVar3;
  
  this->type_ = schema->px->type_;
  (this->value_).content = (placeholder *)0x0;
  init(this,(EVP_PKEY_CTX *)schema);
  this_00 = boost::any_cast<avro::GenericUnion>(&this->value_);
  boost::shared_ptr<avro::Node>::operator=
            ((shared_ptr<avro::Node> *)this_00,(shared_ptr<avro::Node> *)v);
  this_00->curBranch_ = v->curBranch_;
  (this_00->datum_).type_ = (v->datum_).type_;
  ppVar3 = (v->datum_).value_.content;
  if (ppVar3 == (placeholder *)0x0) {
    ppVar3 = (placeholder *)0x0;
  }
  else {
    iVar2 = (*ppVar3->_vptr_placeholder[3])();
    ppVar3 = (placeholder *)CONCAT44(extraout_var,iVar2);
  }
  ppVar1 = (this_00->datum_).value_.content;
  (this_00->datum_).value_.content = ppVar3;
  if (ppVar1 != (placeholder *)0x0) {
    (*ppVar1->_vptr_placeholder[1])();
    return;
  }
  return;
}

Assistant:

GenericDatum(const NodePtr& schema, const T& v) :
        type_(schema->type()) {
        init(schema);
        value<T>() = v;
    }